

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

string * __thiscall
ent::muistringvalue::asstring_abi_cxx11_(string *__return_storage_ptr__,muistringvalue *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  muistringvalue *local_18;
  muistringvalue *this_local;
  
  local_18 = this;
  this_local = (muistringvalue *)__return_storage_ptr__;
  cstrescape<std::__cxx11::string>(&local_58,&this->_value);
  std::operator+(&local_38,"mui_sz:\"",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,"\"");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string asstring()
    {
        return "mui_sz:\""+cstrescape(_value)+"\"";
    }